

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t exr_start_read(exr_context_t *ctxt,char *filename,exr_context_initializer_t *ctxtdata)

{
  _internal_exr_context *p_Var1;
  exr_result_t eVar2;
  int64_t iVar3;
  _internal_exr_context *ret;
  exr_context_initializer_t inits;
  
  ret = (_internal_exr_context *)0x0;
  fill_context_data(&inits,ctxtdata);
  if (ctxt == (exr_context_t *)0x0) {
    if (((byte)inits.flags & 2) == 0) {
      (*inits.error_handler_fn)
                ((exr_const_context_t)0x0,3,"Invalid context handle passed to start_read function");
      return 3;
    }
    return 3;
  }
  if ((filename == (char *)0x0) || (*filename == '\0')) {
    if (((byte)inits.flags & 2) == 0) {
      eVar2 = 3;
      (*inits.error_handler_fn)
                ((exr_const_context_t)0x0,3,"Invalid filename passed to start_read function");
    }
    else {
      eVar2 = 3;
    }
    goto LAB_0010fce3;
  }
  eVar2 = internal_exr_alloc_context(&ret,&inits,EXR_CONTEXT_READ,4);
  if (eVar2 != 0) {
    eVar2 = 1;
    goto LAB_0010fce3;
  }
  ret->do_read = dispatch_read;
  eVar2 = exr_attr_string_create((exr_context_t)ret,&ret->filename,filename);
  if (eVar2 == 0) {
    if (inits.read_fn == (exr_read_func_ptr_t)0x0) {
      inits.size_fn = default_query_size_func;
      eVar2 = default_init_read_file(ret);
      if (eVar2 != 0) goto LAB_0010fd72;
    }
    p_Var1 = ret;
    if (inits.size_fn == (exr_query_size_func_ptr_t)0x0) {
      iVar3 = -1;
    }
    else {
      iVar3 = (*inits.size_fn)((exr_const_context_t)ret,ret->user_data);
    }
    p_Var1->file_size = iVar3;
    eVar2 = internal_exr_parse_header(ret);
    if (eVar2 == 0) {
      eVar2 = 0;
      goto LAB_0010fce3;
    }
  }
LAB_0010fd72:
  exr_finish((exr_context_t *)&ret);
LAB_0010fce3:
  *ctxt = (exr_context_t)ret;
  return eVar2;
}

Assistant:

exr_result_t
exr_start_read (
    exr_context_t*                   ctxt,
    const char*                      filename,
    const exr_context_initializer_t* ctxtdata)
{
    exr_result_t                  rv    = EXR_ERR_UNKNOWN;
    struct _internal_exr_context* ret   = NULL;
    exr_context_initializer_t     inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        if (!(inits.flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE))
            inits.error_handler_fn (
                NULL,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename && filename[0] != '\0')
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_READ,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_read = &dispatch_read;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);
            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.read_fn)
                {
                    inits.size_fn = &default_query_size_func;
                    rv            = default_init_read_file (ret);
                }

                if (rv == EXR_ERR_SUCCESS)
                    rv = process_query_size (ret, &inits);
                if (rv == EXR_ERR_SUCCESS) rv = internal_exr_parse_header (ret);
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        if (!(inits.flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE))
            inits.error_handler_fn (
                NULL,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid filename passed to start_read function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}